

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Settings::RealParam::RealParam(RealParam *this)

{
  string *in_RDI;
  string *local_40;
  string *local_20;
  
  local_20 = in_RDI;
  do {
    std::__cxx11::string::string(local_20);
    local_20 = local_20 + 0x20;
  } while (local_20 != in_RDI + 0x360);
  local_40 = in_RDI + 0x360;
  do {
    std::__cxx11::string::string(local_40);
    local_40 = local_40 + 0x20;
  } while (local_40 != in_RDI + 0x6c0);
  std::__cxx11::string::operator=(in_RDI,"feastol");
  std::__cxx11::string::operator=(in_RDI + 0x360,"primal feasibility tolerance");
  *(undefined8 *)(in_RDI + 0x798) = 0;
  *(undefined8 *)(in_RDI + 0x870) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6c0) = 0x3eb0c6f7a0b5ed8d;
  std::__cxx11::string::operator=(in_RDI + 0x20,"opttol");
  std::__cxx11::string::operator=(in_RDI + 0x380,"dual feasibility tolerance");
  *(undefined8 *)(in_RDI + 0x7a0) = 0;
  *(undefined8 *)(in_RDI + 0x878) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6c8) = 0x3eb0c6f7a0b5ed8d;
  std::__cxx11::string::operator=(in_RDI + 0x40,"epsilon_zero");
  std::__cxx11::string::operator=(in_RDI + 0x3a0,"general zero tolerance");
  *(undefined8 *)(in_RDI + 0x7a8) = 0;
  *(undefined8 *)(in_RDI + 0x880) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6d0) = 0x3c9cd2b297d889bc;
  std::__cxx11::string::operator=(in_RDI + 0x60,"epsilon_factorization");
  std::__cxx11::string::operator=(in_RDI + 0x3c0,"zero tolerance used in factorization");
  *(undefined8 *)(in_RDI + 0x7b0) = 0;
  *(undefined8 *)(in_RDI + 0x888) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6d8) = 0x3bc79ca10c924223;
  std::__cxx11::string::operator=(in_RDI + 0x80,"epsilon_update");
  std::__cxx11::string::operator=
            (in_RDI + 0x3e0,"zero tolerance used in update of the factorization");
  *(undefined8 *)(in_RDI + 0x7b8) = 0;
  *(undefined8 *)(in_RDI + 0x890) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6e0) = 0x3c9cd2b297d889bc;
  std::__cxx11::string::operator=(in_RDI + 0xa0,"epsilon_pivot");
  std::__cxx11::string::operator=(in_RDI + 0x400,"pivot zero tolerance used in factorization");
  *(undefined8 *)(in_RDI + 0x7c0) = 0;
  *(undefined8 *)(in_RDI + 0x898) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x6e8) = 0x3ddb7cdfd9d7bdbb;
  std::__cxx11::string::operator=(in_RDI + 0xc0,"infty");
  std::__cxx11::string::operator=(in_RDI + 0x420,"infinity threshold");
  *(undefined8 *)(in_RDI + 0x7c8) = 0x4202a05f20000000;
  *(undefined8 *)(in_RDI + 0x8a0) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x6f0) = 0x54b249ad2594c37d;
  std::__cxx11::string::operator=(in_RDI + 0xe0,"timelimit");
  std::__cxx11::string::operator=(in_RDI + 0x440,"time limit in seconds");
  *(undefined8 *)(in_RDI + 2000) = 0;
  *(undefined8 *)(in_RDI + 0x8a8) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x6f8) = 0x54b249ad2594c37d;
  std::__cxx11::string::operator=(in_RDI + 0x100,"objlimit_lower");
  std::__cxx11::string::operator=(in_RDI + 0x460,"lower limit on objective value");
  *(undefined8 *)(in_RDI + 0x7d8) = 0xd4b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x8b0) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x700) = 0xd4b249ad2594c37d;
  std::__cxx11::string::operator=(in_RDI + 0x120,"objlimit_upper");
  std::__cxx11::string::operator=(in_RDI + 0x480,"upper limit on objective value");
  *(undefined8 *)(in_RDI + 0x7e0) = 0xd4b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x8b8) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x708) = 0x54b249ad2594c37d;
  std::__cxx11::string::operator=(in_RDI + 0x140,"fpfeastol");
  std::__cxx11::string::operator=
            (in_RDI + 0x4a0,
             "working tolerance for feasibility in floating-point solver during iterative refinement"
            );
  *(undefined8 *)(in_RDI + 0x7e8) = 0;
  *(undefined8 *)(in_RDI + 0x8c0) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x710) = 0x3e112e0be826d695;
  std::__cxx11::string::operator=(in_RDI + 0x160,"fpopttol");
  std::__cxx11::string::operator=
            (in_RDI + 0x4c0,
             "working tolerance for optimality in floating-point solver during iterative refinement"
            );
  *(undefined8 *)(in_RDI + 0x7f0) = 0;
  *(undefined8 *)(in_RDI + 0x8c8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x718) = 0x3e112e0be826d695;
  std::__cxx11::string::operator=(in_RDI + 0x180,"maxscaleincr");
  std::__cxx11::string::operator=
            (in_RDI + 0x4e0,"maximum increase of scaling factors between refinements");
  *(undefined8 *)(in_RDI + 0x7f8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x8d0) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x720) = 0x45208b2a2c280291;
  std::__cxx11::string::operator=(in_RDI + 0x1a0,"liftminval");
  std::__cxx11::string::operator=
            (in_RDI + 0x500,
             "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)"
            );
  *(undefined8 *)(in_RDI + 0x800) = 0;
  *(undefined8 *)(in_RDI + 0x8d8) = 0x3fb999999999999a;
  *(undefined8 *)(in_RDI + 0x728) = 0x3f4ffffeed1f417e;
  std::__cxx11::string::operator=(in_RDI + 0x1c0,"liftmaxval");
  std::__cxx11::string::operator=
            (in_RDI + 0x520,
             "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)"
            );
  *(undefined8 *)(in_RDI + 0x808) = 0x4024000000000000;
  *(undefined8 *)(in_RDI + 0x8e0) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x730) = 0x4090000000000000;
  std::__cxx11::string::operator=(in_RDI + 0x1e0,"sparsity_threshold");
  std::__cxx11::string::operator=
            (in_RDI + 0x540,
             "sparse pricing threshold (#violations < dimension * SPARSITY_THRESHOLD activates sparse pricing)"
            );
  *(undefined8 *)(in_RDI + 0x810) = 0;
  *(undefined8 *)(in_RDI + 0x8e8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x738) = 0x3fe3333333333333;
  std::__cxx11::string::operator=(in_RDI + 0x200,"representation_switch");
  std::__cxx11::string::operator=
            (in_RDI + 0x560,
             "threshold on number of rows vs. number of columns for switching from column to row representations in auto mode"
            );
  *(undefined8 *)(in_RDI + 0x818) = 0;
  *(undefined8 *)(in_RDI + 0x8f0) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x740) = 0x3ff3333333333333;
  std::__cxx11::string::operator=(in_RDI + 0x220,"ratrec_freq");
  std::__cxx11::string::operator=
            (in_RDI + 0x580,"geometric frequency at which to apply rational reconstruction");
  *(undefined8 *)(in_RDI + 0x820) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x8f8) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x748) = 0x3ff3333333333333;
  std::__cxx11::string::operator=(in_RDI + 0x240,"minred");
  std::__cxx11::string::operator=
            (in_RDI + 0x5a0,
             "minimal reduction (sum of removed rows/cols) to continue simplification");
  *(undefined8 *)(in_RDI + 0x828) = 0;
  *(undefined8 *)(in_RDI + 0x900) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x750) = 0x3f1a36e2eb1c432d;
  std::__cxx11::string::operator=(in_RDI + 0x260,"refac_basis_nnz");
  std::__cxx11::string::operator=
            (in_RDI + 0x5c0,
             "refactor threshold for nonzeros in last factorized basis matrix compared to updated basis matrix"
            );
  *(undefined8 *)(in_RDI + 0x830) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x908) = 0x4059000000000000;
  *(undefined8 *)(in_RDI + 0x758) = 0x4024000000000000;
  std::__cxx11::string::operator=(in_RDI + 0x280,"refac_update_fill");
  std::__cxx11::string::operator=
            (in_RDI + 0x5e0,
             "refactor threshold for fill-in in current factor update compared to fill-in in last factorization"
            );
  *(undefined8 *)(in_RDI + 0x838) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x910) = 0x4059000000000000;
  *(undefined8 *)(in_RDI + 0x760) = 0x4014000000000000;
  std::__cxx11::string::operator=(in_RDI + 0x2a0,"refac_mem_factor");
  std::__cxx11::string::operator=
            (in_RDI + 0x600,
             "refactor threshold for memory growth in factorization since last refactorization");
  *(undefined8 *)(in_RDI + 0x840) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x918) = 0x4024000000000000;
  *(undefined8 *)(in_RDI + 0x768) = 0x3ff8000000000000;
  std::__cxx11::string::operator=(in_RDI + 0x2c0,"leastsq_acrcy");
  std::__cxx11::string::operator=
            (in_RDI + 0x620,
             "accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)"
            );
  *(undefined8 *)(in_RDI + 0x848) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x920) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x770) = 0x408f400000000000;
  std::__cxx11::string::operator=(in_RDI + 0x2e0,"obj_offset");
  std::__cxx11::string::operator=(in_RDI + 0x640,"objective offset to be used");
  *(undefined8 *)(in_RDI + 0x850) = 0xd4b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x928) = 0x54b249ad2594c37d;
  *(undefined8 *)(in_RDI + 0x778) = 0;
  std::__cxx11::string::operator=(in_RDI + 0x300,"min_markowitz");
  std::__cxx11::string::operator=(in_RDI + 0x660,"minimal Markowitz threshold in LU factorization");
  *(undefined8 *)(in_RDI + 0x858) = 0x3f1a36e2eb1c432d;
  *(undefined8 *)(in_RDI + 0x930) = 0x3fefff2e48e8a71e;
  *(undefined8 *)(in_RDI + 0x780) = 0x3f847ae147ae147b;
  std::__cxx11::string::operator=(in_RDI + 800,"simplifier_modifyrowfac");
  std::__cxx11::string::operator=
            (in_RDI + 0x680,
             "modify constraints when the number of nonzeros or rows is at most this factor times the number of nonzeros or rows before presolving"
            );
  *(undefined8 *)(in_RDI + 0x860) = 0;
  *(undefined8 *)(in_RDI + 0x938) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x788) = 0x3ff0000000000000;
  std::__cxx11::string::operator=(in_RDI + 0x340,"precision_boosting_factor");
  std::__cxx11::string::operator=
            (in_RDI + 0x6a0,
             "factor by which the precision of the floating-point solver is multiplied");
  *(undefined8 *)(in_RDI + 0x868) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x940) = 0x4024000000000000;
  *(undefined8 *)(in_RDI + 0x790) = 0x3ff8000000000000;
  return;
}

Assistant:

SoPlexBase<R>::Settings::RealParam::RealParam()
{
   // primal feasibility tolerance
   name[SoPlexBase<R>::FEASTOL] = "feastol";
   description[SoPlexBase<R>::FEASTOL] = "primal feasibility tolerance";
   lower[SoPlexBase<R>::FEASTOL] = 0.0;
   upper[SoPlexBase<R>::FEASTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FEASTOL] = 1e-6;

   // dual feasibility tolerance
   name[SoPlexBase<R>::OPTTOL] = "opttol";
   description[SoPlexBase<R>::OPTTOL] = "dual feasibility tolerance";
   lower[SoPlexBase<R>::OPTTOL] = 0.0;
   upper[SoPlexBase<R>::OPTTOL] = 1.0;
   defaultValue[SoPlexBase<R>::OPTTOL] = 1e-6;

   ///@todo define suitable values depending on R type
   // general zero tolerance
   name[SoPlexBase<R>::EPSILON_ZERO] = "epsilon_zero";
   description[SoPlexBase<R>::EPSILON_ZERO] = "general zero tolerance";
   lower[SoPlexBase<R>::EPSILON_ZERO] = 0.0;
   upper[SoPlexBase<R>::EPSILON_ZERO] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_ZERO] = SOPLEX_DEFAULT_EPS_ZERO;

   ///@todo define suitable values depending on R type
   // zero tolerance used in factorization
   name[SoPlexBase<R>::EPSILON_FACTORIZATION] = "epsilon_factorization";
   description[SoPlexBase<R>::EPSILON_FACTORIZATION] = "zero tolerance used in factorization";
   lower[SoPlexBase<R>::EPSILON_FACTORIZATION] = 0.0;
   upper[SoPlexBase<R>::EPSILON_FACTORIZATION] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_FACTORIZATION] = SOPLEX_DEFAULT_EPS_FACTOR;

   ///@todo define suitable values depending on R type
   // zero tolerance used in update of the factorization
   name[SoPlexBase<R>::EPSILON_UPDATE] = "epsilon_update";
   description[SoPlexBase<R>::EPSILON_UPDATE] = "zero tolerance used in update of the factorization";
   lower[SoPlexBase<R>::EPSILON_UPDATE] = 0.0;
   upper[SoPlexBase<R>::EPSILON_UPDATE] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_UPDATE] = SOPLEX_DEFAULT_EPS_UPDATE;

   ///@todo define suitable values depending on R type
   // pivot zero tolerance used in factorization
   name[SoPlexBase<R>::EPSILON_PIVOT] = "epsilon_pivot";
   description[SoPlexBase<R>::EPSILON_PIVOT] = "pivot zero tolerance used in factorization";
   lower[SoPlexBase<R>::EPSILON_PIVOT] = 0.0;
   upper[SoPlexBase<R>::EPSILON_PIVOT] = 1.0;
   defaultValue[SoPlexBase<R>::EPSILON_PIVOT] = SOPLEX_DEFAULT_EPS_PIVOR;

   ///@todo define suitable values depending on R type
   // infinity threshold
   name[SoPlexBase<R>::INFTY] = "infty";
   description[SoPlexBase<R>::INFTY] = "infinity threshold";
   lower[SoPlexBase<R>::INFTY] = 1e10;
   upper[SoPlexBase<R>::INFTY] = 1e100;
   defaultValue[SoPlexBase<R>::INFTY] = SOPLEX_DEFAULT_INFINITY;

   // time limit in seconds (INFTY if unlimited)
   name[SoPlexBase<R>::TIMELIMIT] = "timelimit";
   description[SoPlexBase<R>::TIMELIMIT] = "time limit in seconds";
   lower[SoPlexBase<R>::TIMELIMIT] = 0.0;
   upper[SoPlexBase<R>::TIMELIMIT] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::TIMELIMIT] = SOPLEX_DEFAULT_INFINITY;

   // lower limit on objective value
   name[SoPlexBase<R>::OBJLIMIT_LOWER] = "objlimit_lower";
   description[SoPlexBase<R>::OBJLIMIT_LOWER] = "lower limit on objective value";
   lower[SoPlexBase<R>::OBJLIMIT_LOWER] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJLIMIT_LOWER] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJLIMIT_LOWER] = -SOPLEX_DEFAULT_INFINITY;

   // upper limit on objective value
   name[SoPlexBase<R>::OBJLIMIT_UPPER] = "objlimit_upper";
   description[SoPlexBase<R>::OBJLIMIT_UPPER] = "upper limit on objective value";
   lower[SoPlexBase<R>::OBJLIMIT_UPPER] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJLIMIT_UPPER] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJLIMIT_UPPER] = SOPLEX_DEFAULT_INFINITY;

   // working tolerance for feasibility in floating-point solver during iterative refinement
   name[SoPlexBase<R>::FPFEASTOL] = "fpfeastol";
   description[SoPlexBase<R>::FPFEASTOL] =
      "working tolerance for feasibility in floating-point solver during iterative refinement";
   lower[SoPlexBase<R>::FPFEASTOL] = 0;
   upper[SoPlexBase<R>::FPFEASTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FPFEASTOL] = 1e-9;

   // working tolerance for optimality in floating-point solver during iterative refinement
   name[SoPlexBase<R>::FPOPTTOL] = "fpopttol";
   description[SoPlexBase<R>::FPOPTTOL] =
      "working tolerance for optimality in floating-point solver during iterative refinement";
   lower[SoPlexBase<R>::FPOPTTOL] = 0;
   upper[SoPlexBase<R>::FPOPTTOL] = 1.0;
   defaultValue[SoPlexBase<R>::FPOPTTOL] = 1e-9;

   // maximum increase of scaling factors between refinements
   name[SoPlexBase<R>::MAXSCALEINCR] = "maxscaleincr";
   description[SoPlexBase<R>::MAXSCALEINCR] =
      "maximum increase of scaling factors between refinements";
   lower[SoPlexBase<R>::MAXSCALEINCR] = 1.0;
   upper[SoPlexBase<R>::MAXSCALEINCR] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::MAXSCALEINCR] = 1e25;

   // lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)
   name[SoPlexBase<R>::LIFTMINVAL] = "liftminval";
   description[SoPlexBase<R>::LIFTMINVAL] =
      "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)";
   lower[SoPlexBase<R>::LIFTMINVAL] = 0.0;
   upper[SoPlexBase<R>::LIFTMINVAL] = 0.1;
   defaultValue[SoPlexBase<R>::LIFTMINVAL] = 0.000976562; // = 1/1024

   // upper threshold in lifting (nonzero matrix coefficients with larger absolute value will be reformulated)
   name[SoPlexBase<R>::LIFTMAXVAL] = "liftmaxval";
   description[SoPlexBase<R>::LIFTMAXVAL] =
      "lower threshold in lifting (nonzero matrix coefficients with smaller absolute value will be reformulated)";
   lower[SoPlexBase<R>::LIFTMAXVAL] = 10.0;
   upper[SoPlexBase<R>::LIFTMAXVAL] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::LIFTMAXVAL] = 1024.0;

   // threshold for using sparse pricing (no. of violations need to be smaller than threshold * dimension of problem)
   name[SoPlexBase<R>::SPARSITY_THRESHOLD] = "sparsity_threshold";
   description[SoPlexBase<R>::SPARSITY_THRESHOLD] =
      "sparse pricing threshold (#violations < dimension * SPARSITY_THRESHOLD activates sparse pricing)";
   lower[SoPlexBase<R>::SPARSITY_THRESHOLD] = 0.0;
   upper[SoPlexBase<R>::SPARSITY_THRESHOLD] = 1.0;
   defaultValue[SoPlexBase<R>::SPARSITY_THRESHOLD] = 0.6;

   // threshold on number of rows vs. number of columns for switching from column to row representations in auto mode
   name[SoPlexBase<R>::REPRESENTATION_SWITCH] = "representation_switch";
   description[SoPlexBase<R>::REPRESENTATION_SWITCH] =
      "threshold on number of rows vs. number of columns for switching from column to row representations in auto mode";
   lower[SoPlexBase<R>::REPRESENTATION_SWITCH] = 0.0;
   upper[SoPlexBase<R>::REPRESENTATION_SWITCH] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::REPRESENTATION_SWITCH] = 1.2;

   // geometric frequency at which to apply rational reconstruction
   name[SoPlexBase<R>::RATREC_FREQ] = "ratrec_freq";
   description[SoPlexBase<R>::RATREC_FREQ] =
      "geometric frequency at which to apply rational reconstruction";
   lower[SoPlexBase<R>::RATREC_FREQ] = 1.0;
   upper[SoPlexBase<R>::RATREC_FREQ] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::RATREC_FREQ] = 1.2;

   // minimal reduction (sum of removed rows/cols) to continue simplification
   name[SoPlexBase<R>::MINRED] = "minred";
   description[SoPlexBase<R>::MINRED] =
      "minimal reduction (sum of removed rows/cols) to continue simplification";
   lower[SoPlexBase<R>::MINRED] = 0.0;
   upper[SoPlexBase<R>::MINRED] = 1.0;
   defaultValue[SoPlexBase<R>::MINRED] = 1e-4;

   // refactor threshold for nonzeros in last factorized basis matrix compared to updated basis matrix
   name[SoPlexBase<R>::REFAC_BASIS_NNZ] = "refac_basis_nnz";
   description[SoPlexBase<R>::REFAC_BASIS_NNZ] =
      "refactor threshold for nonzeros in last factorized basis matrix compared to updated basis matrix";
   lower[SoPlexBase<R>::REFAC_BASIS_NNZ] = 1.0;
   upper[SoPlexBase<R>::REFAC_BASIS_NNZ] = 100.0;
   defaultValue[SoPlexBase<R>::REFAC_BASIS_NNZ] = 10.0;

   // refactor threshold for fill-in in current factor update compared to fill-in in last factorization
   name[SoPlexBase<R>::REFAC_UPDATE_FILL] = "refac_update_fill";
   description[SoPlexBase<R>::REFAC_UPDATE_FILL] =
      "refactor threshold for fill-in in current factor update compared to fill-in in last factorization";
   lower[SoPlexBase<R>::REFAC_UPDATE_FILL] = 1.0;
   upper[SoPlexBase<R>::REFAC_UPDATE_FILL] = 100.0;
   defaultValue[SoPlexBase<R>::REFAC_UPDATE_FILL] = 5.0;

   // refactor threshold for memory growth in factorization since last refactorization
   name[SoPlexBase<R>::REFAC_MEM_FACTOR] = "refac_mem_factor";
   description[SoPlexBase<R>::REFAC_MEM_FACTOR] =
      "refactor threshold for memory growth in factorization since last refactorization";
   lower[SoPlexBase<R>::REFAC_MEM_FACTOR] = 1.0;
   upper[SoPlexBase<R>::REFAC_MEM_FACTOR] = 10.0;
   defaultValue[SoPlexBase<R>::REFAC_MEM_FACTOR] = 1.5;

   // accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)
   name[SoPlexBase<R>::LEASTSQ_ACRCY] = "leastsq_acrcy";
   description[SoPlexBase<R>::LEASTSQ_ACRCY] =
      "accuracy of conjugate gradient method in least squares scaling (higher value leads to more iterations)";
   lower[SoPlexBase<R>::LEASTSQ_ACRCY] = 1.0;
   upper[SoPlexBase<R>::LEASTSQ_ACRCY] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::LEASTSQ_ACRCY] = 1000.0;

   // objective offset
   name[SoPlexBase<R>::OBJ_OFFSET] = "obj_offset";
   description[SoPlexBase<R>::OBJ_OFFSET] = "objective offset to be used";
   lower[SoPlexBase<R>::OBJ_OFFSET] = -SOPLEX_DEFAULT_INFINITY;
   upper[SoPlexBase<R>::OBJ_OFFSET] = SOPLEX_DEFAULT_INFINITY;
   defaultValue[SoPlexBase<R>::OBJ_OFFSET] = 0.0;

   // minimal Markowitz threshold to control sparsity/stability in LU factorization
   name[SoPlexBase<R>::MIN_MARKOWITZ] = "min_markowitz";
   description[SoPlexBase<R>::MIN_MARKOWITZ] = "minimal Markowitz threshold in LU factorization";
   lower[SoPlexBase<R>::MIN_MARKOWITZ] = 0.0001;
   upper[SoPlexBase<R>::MIN_MARKOWITZ] = 0.9999;
   defaultValue[SoPlexBase<R>::MIN_MARKOWITZ] = 0.01;

   // modification
   name[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = "simplifier_modifyrowfac";
   description[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] =
      "modify constraints when the number of nonzeros or rows is at most this factor times the number of nonzeros or rows before presolving";
   lower[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 0;
   upper[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 1;
   defaultValue[SoPlexBase<R>::SIMPLIFIER_MODIFYROWFAC] = 1.0;

   // factor by which the precision of the floating-point solver is multiplied
   name[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = "precision_boosting_factor";
   description[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] =
      "factor by which the precision of the floating-point solver is multiplied";
   lower[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 1.0;
   upper[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 10.0;
   defaultValue[SoPlexBase<R>::PRECISION_BOOSTING_FACTOR] = 1.5;
}